

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssbinLoader.cpp
# Opt level: O2

void __thiscall
Assimp::AssbinImporter::ReadBinaryNode
          (AssbinImporter *this,IOStream *stream,aiNode **onode,aiNode *parent)

{
  float *pfVar1;
  long lVar2;
  unique_ptr<aiNode,_std::default_delete<aiNode>_> uVar3;
  bool bVar4;
  unsigned_short uVar5;
  uint uVar6;
  uint uVar7;
  uint numProperties;
  uint uVar8;
  ai_uint32 aVar9;
  __uniq_ptr_data<aiNode,_std::default_delete<aiNode>,_true,_true> this_00;
  void *pvVar10;
  aiMetadata *paVar11;
  double dVar12;
  aiString *paVar13;
  DeadlyImportError *this_01;
  long lVar14;
  uint i;
  ulong uVar15;
  long lVar16;
  float fVar17;
  aiVector3D aVar18;
  unique_ptr<aiNode,_std::default_delete<aiNode>_> node;
  undefined1 local_438 [4];
  float fStack_434;
  size_type sStack_430;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_428;
  char local_418 [8];
  char acStack_410 [8];
  char local_408 [8];
  char acStack_400 [976];
  
  uVar6 = Read<unsigned_int>(stream);
  if (uVar6 != 0x123c) {
    this_01 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_438,"Magic chunk identifiers are wrong!",(allocator<char> *)&node);
    DeadlyImportError::DeadlyImportError(this_01,(string *)local_438);
    __cxa_throw(this_01,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  Read<unsigned_int>(stream);
  this_00.super___uniq_ptr_impl<aiNode,_std::default_delete<aiNode>_>._M_t.
  super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>.
  super__Head_base<0UL,_aiNode_*,_false>._M_head_impl =
       (__uniq_ptr_impl<aiNode,_std::default_delete<aiNode>_>)operator_new(0x478);
  aiNode::aiNode((aiNode *)
                 this_00.super___uniq_ptr_impl<aiNode,_std::default_delete<aiNode>_>._M_t.
                 super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>.
                 super__Head_base<0UL,_aiNode_*,_false>._M_head_impl);
  node._M_t.super___uniq_ptr_impl<aiNode,_std::default_delete<aiNode>_>._M_t.
  super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>.
  super__Head_base<0UL,_aiNode_*,_false>._M_head_impl =
       (__uniq_ptr_data<aiNode,_std::default_delete<aiNode>,_true,_true>)
       (__uniq_ptr_data<aiNode,_std::default_delete<aiNode>,_true,_true>)
       this_00.super___uniq_ptr_impl<aiNode,_std::default_delete<aiNode>_>._M_t.
       super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>.
       super__Head_base<0UL,_aiNode_*,_false>._M_head_impl;
  Read<aiString>((aiString *)local_438,stream);
  uVar3._M_t.super___uniq_ptr_impl<aiNode,_std::default_delete<aiNode>_>._M_t.
  super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>.
  super__Head_base<0UL,_aiNode_*,_false>._M_head_impl =
       node._M_t.super___uniq_ptr_impl<aiNode,_std::default_delete<aiNode>_>._M_t.
       super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>.
       super__Head_base<0UL,_aiNode_*,_false>._M_head_impl;
  if (node._M_t.super___uniq_ptr_impl<aiNode,_std::default_delete<aiNode>_>._M_t.
      super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>.
      super__Head_base<0UL,_aiNode_*,_false>._M_head_impl !=
      (__uniq_ptr_data<aiNode,_std::default_delete<aiNode>,_true,_true>)local_438) {
    uVar15 = (ulong)(uint)local_438;
    *(undefined1 (*) [4])
     node._M_t.super___uniq_ptr_impl<aiNode,_std::default_delete<aiNode>_>._M_t.
     super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>.
     super__Head_base<0UL,_aiNode_*,_false>._M_head_impl = local_438;
    memcpy((void *)((long)node._M_t.super___uniq_ptr_impl<aiNode,_std::default_delete<aiNode>_>._M_t
                          .super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>.
                          super__Head_base<0UL,_aiNode_*,_false>._M_head_impl + 4),&fStack_434,
           uVar15);
    *(undefined1 *)
     ((long)uVar3._M_t.super___uniq_ptr_impl<aiNode,_std::default_delete<aiNode>_>._M_t.
            super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>.
            super__Head_base<0UL,_aiNode_*,_false>._M_head_impl + 4 + uVar15) = 0;
  }
  Read<aiMatrix4x4t<float>>((aiMatrix4x4 *)local_438,stream);
  *(char (*) [8])
   ((long)node._M_t.super___uniq_ptr_impl<aiNode,_std::default_delete<aiNode>_>._M_t.
          super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>.
          super__Head_base<0UL,_aiNode_*,_false>._M_head_impl + 0x434) = local_408;
  *(undefined8 *)
   ((long)node._M_t.super___uniq_ptr_impl<aiNode,_std::default_delete<aiNode>_>._M_t.
          super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>.
          super__Head_base<0UL,_aiNode_*,_false>._M_head_impl + 0x43c) = acStack_400._0_8_;
  *(char (*) [8])
   ((long)node._M_t.super___uniq_ptr_impl<aiNode,_std::default_delete<aiNode>_>._M_t.
          super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>.
          super__Head_base<0UL,_aiNode_*,_false>._M_head_impl + 0x424) = local_418;
  *(char (*) [8])
   ((long)node._M_t.super___uniq_ptr_impl<aiNode,_std::default_delete<aiNode>_>._M_t.
          super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>.
          super__Head_base<0UL,_aiNode_*,_false>._M_head_impl + 0x42c) = acStack_410;
  *(size_type *)
   ((long)node._M_t.super___uniq_ptr_impl<aiNode,_std::default_delete<aiNode>_>._M_t.
          super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>.
          super__Head_base<0UL,_aiNode_*,_false>._M_head_impl + 0x414) =
       local_428._M_allocated_capacity;
  *(undefined8 *)
   ((long)node._M_t.super___uniq_ptr_impl<aiNode,_std::default_delete<aiNode>_>._M_t.
          super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>.
          super__Head_base<0UL,_aiNode_*,_false>._M_head_impl + 0x41c) = local_428._8_8_;
  *(ulong *)((long)node._M_t.super___uniq_ptr_impl<aiNode,_std::default_delete<aiNode>_>._M_t.
                   super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>.
                   super__Head_base<0UL,_aiNode_*,_false>._M_head_impl + 0x404) =
       CONCAT44(fStack_434,local_438);
  *(size_type *)
   ((long)node._M_t.super___uniq_ptr_impl<aiNode,_std::default_delete<aiNode>_>._M_t.
          super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>.
          super__Head_base<0UL,_aiNode_*,_false>._M_head_impl + 0x40c) = sStack_430;
  uVar6 = Read<unsigned_int>(stream);
  uVar7 = Read<unsigned_int>(stream);
  numProperties = Read<unsigned_int>(stream);
  if (parent != (aiNode *)0x0) {
    *(aiNode **)
     ((long)node._M_t.super___uniq_ptr_impl<aiNode,_std::default_delete<aiNode>_>._M_t.
            super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>.
            super__Head_base<0UL,_aiNode_*,_false>._M_head_impl + 0x448) = parent;
  }
  if (uVar7 != 0) {
    pvVar10 = operator_new__((ulong)uVar7 * 4);
    *(void **)((long)node._M_t.super___uniq_ptr_impl<aiNode,_std::default_delete<aiNode>_>._M_t.
                     super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>.
                     super__Head_base<0UL,_aiNode_*,_false>._M_head_impl + 0x468) = pvVar10;
    for (uVar15 = 0; uVar7 != uVar15; uVar15 = uVar15 + 1) {
      uVar8 = Read<unsigned_int>(stream);
      *(uint *)(*(long *)((long)node._M_t.
                                super___uniq_ptr_impl<aiNode,_std::default_delete<aiNode>_>._M_t.
                                super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>.
                                super__Head_base<0UL,_aiNode_*,_false>._M_head_impl + 0x468) +
               uVar15 * 4) = uVar8;
      *(int *)((long)node._M_t.super___uniq_ptr_impl<aiNode,_std::default_delete<aiNode>_>._M_t.
                     super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>.
                     super__Head_base<0UL,_aiNode_*,_false>._M_head_impl + 0x460) =
           *(int *)((long)node._M_t.super___uniq_ptr_impl<aiNode,_std::default_delete<aiNode>_>._M_t
                          .super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>.
                          super__Head_base<0UL,_aiNode_*,_false>._M_head_impl + 0x460) + 1;
    }
  }
  if (uVar6 != 0) {
    pvVar10 = operator_new__((ulong)uVar6 << 3);
    *(void **)((long)node._M_t.super___uniq_ptr_impl<aiNode,_std::default_delete<aiNode>_>._M_t.
                     super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>.
                     super__Head_base<0UL,_aiNode_*,_false>._M_head_impl + 0x458) = pvVar10;
    for (uVar15 = 0; (ulong)uVar6 << 3 != uVar15; uVar15 = uVar15 + 8) {
      ReadBinaryNode(this,stream,
                     (aiNode **)
                     (*(long *)((long)node._M_t.
                                      super___uniq_ptr_impl<aiNode,_std::default_delete<aiNode>_>.
                                      _M_t.
                                      super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>
                                      .super__Head_base<0UL,_aiNode_*,_false>._M_head_impl + 0x458)
                     + uVar15),
                     (aiNode *)
                     node._M_t.super___uniq_ptr_impl<aiNode,_std::default_delete<aiNode>_>._M_t.
                     super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>.
                     super__Head_base<0UL,_aiNode_*,_false>._M_head_impl);
      *(int *)((long)node._M_t.super___uniq_ptr_impl<aiNode,_std::default_delete<aiNode>_>._M_t.
                     super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>.
                     super__Head_base<0UL,_aiNode_*,_false>._M_head_impl + 0x450) =
           *(int *)((long)node._M_t.super___uniq_ptr_impl<aiNode,_std::default_delete<aiNode>_>._M_t
                          .super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>.
                          super__Head_base<0UL,_aiNode_*,_false>._M_head_impl + 0x450) + 1;
    }
  }
  if (numProperties != 0) {
    paVar11 = aiMetadata::Alloc(numProperties);
    *(aiMetadata **)
     ((long)node._M_t.super___uniq_ptr_impl<aiNode,_std::default_delete<aiNode>_>._M_t.
            super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>.
            super__Head_base<0UL,_aiNode_*,_false>._M_head_impl + 0x470) = paVar11;
    lVar14 = 0;
    for (lVar16 = 0; (ulong)numProperties << 4 != lVar16; lVar16 = lVar16 + 0x10) {
      Read<aiString>((aiString *)local_438,stream);
      lVar2 = *(long *)(*(long *)((long)node._M_t.
                                        super___uniq_ptr_impl<aiNode,_std::default_delete<aiNode>_>.
                                        _M_t.
                                        super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>
                                        .super__Head_base<0UL,_aiNode_*,_false>._M_head_impl + 0x470
                                 ) + 8);
      paVar13 = (aiString *)(lVar2 + lVar14);
      if (paVar13 != (aiString *)local_438) {
        uVar15 = (ulong)(uint)local_438;
        pfVar1 = (float *)(lVar2 + lVar14);
        *pfVar1 = (float)local_438;
        memcpy(pfVar1 + 1,&fStack_434,uVar15);
        paVar13->data[uVar15] = '\0';
      }
      uVar5 = Read<unsigned_short>(stream);
      *(uint *)(*(long *)(*(long *)((long)node._M_t.
                                          super___uniq_ptr_impl<aiNode,_std::default_delete<aiNode>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>
                                          .super__Head_base<0UL,_aiNode_*,_false>._M_head_impl +
                                   0x470) + 0x10) + lVar16) = (uint)uVar5;
      switch(*(undefined4 *)
              (*(long *)(*(long *)((long)node._M_t.
                                         super___uniq_ptr_impl<aiNode,_std::default_delete<aiNode>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>
                                         .super__Head_base<0UL,_aiNode_*,_false>._M_head_impl +
                                  0x470) + 0x10) + lVar16)) {
      case 0:
        paVar13 = (aiString *)operator_new(1);
        bVar4 = Read<bool>(stream);
        *(bool *)&paVar13->length = bVar4;
        break;
      case 1:
        paVar13 = (aiString *)operator_new(4);
        aVar9 = Read<int>(stream);
        paVar13->length = aVar9;
        break;
      case 2:
        paVar13 = (aiString *)operator_new(8);
        dVar12 = (double)Read<unsigned_long>(stream);
        *(double *)paVar13 = dVar12;
        break;
      case 3:
        paVar13 = (aiString *)operator_new(4);
        fVar17 = Read<float>(stream);
        paVar13->length = (ai_uint32)fVar17;
        break;
      case 4:
        paVar13 = (aiString *)operator_new(8);
        dVar12 = Read<double>(stream);
        *(double *)paVar13 = dVar12;
        break;
      case 5:
        paVar13 = (aiString *)operator_new(0x404);
        Read<aiString>(paVar13,stream);
        break;
      case 6:
        paVar13 = (aiString *)operator_new(0xc);
        aVar18 = Read<aiVector3t<float>>(stream);
        *(double *)paVar13 = aVar18._0_8_;
        *(float *)(paVar13->data + 4) = aVar18.z;
        break;
      default:
        paVar13 = (aiString *)0x0;
      }
      *(aiString **)
       (*(long *)(*(long *)((long)node._M_t.
                                  super___uniq_ptr_impl<aiNode,_std::default_delete<aiNode>_>._M_t.
                                  super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>.
                                  super__Head_base<0UL,_aiNode_*,_false>._M_head_impl + 0x470) +
                 0x10) + 8 + lVar16) = paVar13;
      lVar14 = lVar14 + 0x404;
    }
  }
  uVar3._M_t.super___uniq_ptr_impl<aiNode,_std::default_delete<aiNode>_>._M_t.
  super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>.
  super__Head_base<0UL,_aiNode_*,_false>._M_head_impl =
       node._M_t.super___uniq_ptr_impl<aiNode,_std::default_delete<aiNode>_>._M_t.
       super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>.
       super__Head_base<0UL,_aiNode_*,_false>._M_head_impl;
  node._M_t.super___uniq_ptr_impl<aiNode,_std::default_delete<aiNode>_>._M_t.
  super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>.
  super__Head_base<0UL,_aiNode_*,_false>._M_head_impl =
       (__uniq_ptr_data<aiNode,_std::default_delete<aiNode>,_true,_true>)
       (__uniq_ptr_impl<aiNode,_std::default_delete<aiNode>_>)0x0;
  *onode = (aiNode *)
           uVar3._M_t.super___uniq_ptr_impl<aiNode,_std::default_delete<aiNode>_>._M_t.
           super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>.
           super__Head_base<0UL,_aiNode_*,_false>._M_head_impl;
  std::unique_ptr<aiNode,_std::default_delete<aiNode>_>::~unique_ptr(&node);
  return;
}

Assistant:

void AssbinImporter::ReadBinaryNode( IOStream * stream, aiNode** onode, aiNode* parent ) {
    if(Read<uint32_t>(stream) != ASSBIN_CHUNK_AINODE)
        throw DeadlyImportError("Magic chunk identifiers are wrong!");
    /*uint32_t size =*/ Read<uint32_t>(stream);

    std::unique_ptr<aiNode> node(new aiNode());

    node->mName = Read<aiString>(stream);
    node->mTransformation = Read<aiMatrix4x4>(stream);
    unsigned numChildren = Read<unsigned int>(stream);
    unsigned numMeshes = Read<unsigned int>(stream);
	unsigned int nb_metadata = Read<unsigned int>(stream);

    if(parent) {
        node->mParent = parent;
    }

    if (numMeshes)
    {
        node->mMeshes = new unsigned int[numMeshes];
        for (unsigned int i = 0; i < numMeshes; ++i) {
            node->mMeshes[i] = Read<unsigned int>(stream);
            node->mNumMeshes++;
        }
    }

    if (numChildren) {
        node->mChildren = new aiNode*[numChildren];
        for (unsigned int i = 0; i < numChildren; ++i) {
            ReadBinaryNode( stream, &node->mChildren[i], node.get() );
            node->mNumChildren++;
        }
    }

    if ( nb_metadata > 0 ) {
        node->mMetaData = aiMetadata::Alloc(nb_metadata);
        for (unsigned int i = 0; i < nb_metadata; ++i) {
            node->mMetaData->mKeys[i] = Read<aiString>(stream);
            node->mMetaData->mValues[i].mType = (aiMetadataType) Read<uint16_t>(stream);
            void* data = nullptr;

            switch (node->mMetaData->mValues[i].mType) {
                case AI_BOOL:
                    data = new bool(Read<bool>(stream));
                    break;
                case AI_INT32:
                    data = new int32_t(Read<int32_t>(stream));
                    break;
                case AI_UINT64:
                    data = new uint64_t(Read<uint64_t>(stream));
                    break;
                case AI_FLOAT:
                    data = new float(Read<float>(stream));
                    break;
                case AI_DOUBLE:
                    data = new double(Read<double>(stream));
                    break;
                case AI_AISTRING:
                    data = new aiString(Read<aiString>(stream));
                    break;
                case AI_AIVECTOR3D:
                    data = new aiVector3D(Read<aiVector3D>(stream));
                    break;
#ifndef SWIG
                case FORCE_32BIT:
#endif // SWIG
                default:
                    break;
            }

			node->mMetaData->mValues[i].mData = data;
		}
	}
    *onode = node.release();
}